

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDEdgeSharpness::SetEdgeChainSharpness
          (ON_SubDEdgeSharpness *this,ON_Interval chain_sharpness_range,uint edge_count,
          ON_SimpleArray<ON_SubDEdgeSharpness> *chain_edge_sharpness)

{
  ON_SubDEdgeSharpness *pOVar1;
  ON_SubDEdgeSharpness *chain_edge_sharpness_00;
  undefined4 in_register_00000034;
  ON_SimpleArray<ON_SubDEdgeSharpness> *this_00;
  int count;
  uint rc;
  ON_SimpleArray<ON_SubDEdgeSharpness> *chain_edge_sharpness_local;
  uint edge_count_local;
  ON_Interval chain_sharpness_range_local;
  
  this_00 = (ON_SimpleArray<ON_SubDEdgeSharpness> *)CONCAT44(in_register_00000034,edge_count);
  count = (int)this;
  if ((count == 0) || (count == -1)) {
    chain_sharpness_range_local.m_t[1]._4_4_ = 0;
  }
  else {
    ON_SimpleArray<ON_SubDEdgeSharpness>::Reserve(this_00,(ulong)this & 0xffffffff);
    ON_SimpleArray<ON_SubDEdgeSharpness>::SetCount(this_00,count);
    pOVar1 = ON_SimpleArray<ON_SubDEdgeSharpness>::Array(this_00);
    chain_sharpness_range_local.m_t[1]._4_4_ =
         SetEdgeChainSharpness
                   ((ON_SubDEdgeSharpness *)((ulong)this & 0xffffffff),chain_sharpness_range,
                    (uint)pOVar1,chain_edge_sharpness_00);
    if (chain_sharpness_range_local.m_t[1]._4_4_ == 0) {
      ON_SimpleArray<ON_SubDEdgeSharpness>::SetCount(this_00,0);
    }
  }
  return chain_sharpness_range_local.m_t[1]._4_4_;
}

Assistant:

unsigned ON_SubDEdgeSharpness::SetEdgeChainSharpness(
  ON_Interval chain_sharpness_range,
  unsigned edge_count,
  ON_SimpleArray<ON_SubDEdgeSharpness>& chain_edge_sharpness
)
{
  if (edge_count <= 0 || edge_count >= ON_UNSET_UINT_INDEX)
    return 0;
  chain_edge_sharpness.Reserve(edge_count);
  chain_edge_sharpness.SetCount(edge_count);
  const unsigned rc = ON_SubDEdgeSharpness::SetEdgeChainSharpness(chain_sharpness_range, edge_count, chain_edge_sharpness.Array());
  if (rc <= 0)
    chain_edge_sharpness.SetCount(0);
  return rc;
}